

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  int cy;
  uchar *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  undefined8 ptr;
  int iVar11;
  int iVar12;
  uint uVar13;
  int num_vertices;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  stbtt_vertex *vertices;
  ushort *puVar17;
  stbtt_vertex *psVar18;
  long lVar19;
  short sVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  byte bVar25;
  short sVar26;
  byte bVar27;
  ulong uVar28;
  ushort uVar29;
  long lVar30;
  uint uVar31;
  undefined1 auVar33 [8];
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar43;
  float fVar44;
  int cx;
  ushort *local_120;
  ulong local_110;
  ulong local_108;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  stbtt__csctx local_a8;
  stbtt__csctx count_ctx;
  ulong uVar24;
  ulong uVar32;
  
  if ((info->cff).size == 0) {
    puVar4 = info->data;
    uVar13 = stbtt__GetGlyfOffset(info,glyph_index);
    *pvertices = (stbtt_vertex *)0x0;
    uVar15 = 0;
    if (-1 < (int)uVar13) {
      uVar16 = (ulong)uVar13;
      uVar10 = CONCAT11(puVar4[uVar16],puVar4[uVar16 + 1]);
      if ((short)uVar10 < 1) {
        if (uVar10 == 0xffff) {
          uVar22 = 0;
          vertices = (stbtt_vertex *)0x0;
          puVar17 = (ushort *)(puVar4 + uVar16 + 10);
          for (bVar25 = 1; uVar15 = (uint)uVar22, bVar25 != 0; bVar25 = bVar25 & 0x20) {
            count_ctx.bounds = 0;
            count_ctx.started = 0;
            bVar25 = *(byte *)((long)puVar17 + 1);
            if ((bVar25 & 2) == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imstb_truetype.h"
                            ,0x70b,
                            "int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *, int, stbtt_vertex **)"
                           );
            }
            if ((bVar25 & 1) == 0) {
              iVar11 = (int)(char)puVar17[2];
              iVar12 = (int)((long)((ulong)*(byte *)((long)puVar17 + 5) << 0x38) >> 0x38);
              lVar19 = 6;
            }
            else {
              auVar6._9_7_ = 0;
              auVar6._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
              auVar5._10_6_ = 0;
              auVar5._0_10_ = SUB1610(auVar6 << 0x38,6);
              auVar40._11_5_ = 0;
              auVar40._0_11_ = SUB1611(auVar5 << 0x30,5);
              auVar7._1_12_ = SUB1612(auVar40 << 0x28,4);
              auVar7[0] = (char)puVar17[3];
              auVar7._13_3_ = 0;
              auVar36._1_14_ = SUB1614(auVar7 << 0x18,2);
              auVar36[0] = (char)puVar17[2];
              auVar36[0xf] = 0;
              auVar36 = ZEXT416((uint)*(byte *)((long)puVar17 + 7) << 0x10 |
                                (uint)*(byte *)((long)puVar17 + 5)) | auVar36 << 8;
              iVar11 = (int)auVar36._0_2_;
              iVar12 = (int)auVar36._2_2_;
              lVar19 = 8;
            }
            local_120 = (ushort *)(lVar19 + (long)puVar17);
            if ((bVar25 & 8) == 0) {
              if ((bVar25 & 0x40) != 0) {
                uVar10 = *local_120;
                fVar38 = (float)(int)(short)(local_120[1] << 8 | local_120[1] >> 8) * 6.1035156e-05;
                local_120 = local_120 + 2;
                _local_f8 = ZEXT416((uint)((float)(int)(short)(uVar10 << 8 | uVar10 >> 8) *
                                          6.1035156e-05));
                goto LAB_0012b97c;
              }
              if ((char)bVar25 < '\0') {
                local_f8._0_4_ =
                     (float)(int)CONCAT11((char)*local_120,*(undefined1 *)((long)local_120 + 1)) *
                     6.1035156e-05;
                local_f8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)local_120[2],
                                                         *(undefined1 *)((long)local_120 + 5)) <<
                                        0x30) >> 0x30) * 6.1035156e-05;
                _fStack_f0 = 0;
                local_d8._0_4_ =
                     (float)(int)CONCAT11((char)local_120[1],*(undefined1 *)((long)local_120 + 3)) *
                     6.1035156e-05;
                local_d8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)local_120[3],
                                                         *(undefined1 *)((long)local_120 + 7)) <<
                                        0x30) >> 0x30) * 6.1035156e-05;
                local_d8._8_8_ = 0;
                local_120 = local_120 + 4;
              }
              else {
                _local_f8 = ZEXT812(0x3f800000);
                fStack_ec = 0.0;
                local_d8 = ZEXT816(0x3f80000000000000);
              }
            }
            else {
              fVar38 = (float)(int)(short)(*local_120 << 8 | *local_120 >> 8) * 6.1035156e-05;
              local_120 = local_120 + 1;
              register0x00001244 = SUB1612((undefined1  [16])0x0,4);
              local_f8._0_4_ = fVar38;
LAB_0012b97c:
              local_d8 = ZEXT416((uint)fVar38) << 0x20;
            }
            uVar13 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar17[1] << 8 | puVar17[1] >> 8),
                                         (stbtt_vertex **)&count_ctx);
            ptr = count_ctx._0_8_;
            if (0 < (int)uVar13) {
              fVar38 = local_d8._0_4_;
              fVar41 = local_d8._4_4_;
              auVar35._0_4_ = fVar38 * fVar38;
              auVar35._4_4_ = fVar41 * fVar41;
              auVar35._8_4_ = local_d8._8_4_ * local_d8._8_4_;
              auVar35._12_4_ = local_d8._12_4_ * local_d8._12_4_;
              auVar37._0_4_ = (float)local_f8._0_4_ * (float)local_f8._0_4_ + auVar35._0_4_;
              auVar37._4_4_ = (float)local_f8._4_4_ * (float)local_f8._4_4_ + auVar35._4_4_;
              auVar37._8_4_ = fStack_f0 * fStack_f0 + auVar35._8_4_;
              auVar37._12_4_ = fStack_ec * fStack_ec + auVar35._12_4_;
              auVar36 = sqrtps(auVar35,auVar37);
              for (lVar19 = 0; (ulong)uVar13 * 0xe - lVar19 != 0; lVar19 = lVar19 + 0xe) {
                fVar42 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 4 + lVar19) <<
                                            0x30) >> 0x30);
                fVar43 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + lVar19);
                fVar44 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 6 + lVar19) <<
                                            0x30) >> 0x30);
                auVar39._0_4_ =
                     (int)((fVar43 * (float)local_f8._4_4_ +
                            (float)(int)*(short *)(count_ctx._0_8_ + lVar19) * (float)local_f8._0_4_
                           + (float)iVar11) * auVar36._0_4_);
                auVar39._4_4_ =
                     (int)((fVar43 * fVar41 +
                            (float)(int)*(short *)(count_ctx._0_8_ + lVar19) * fVar38 +
                           (float)iVar12) * auVar36._4_4_);
                auVar39._8_4_ =
                     (int)((fVar44 * (float)local_f8._4_4_ + fVar42 * (float)local_f8._0_4_ +
                           (float)iVar11) * auVar36._0_4_);
                auVar39._12_4_ =
                     (int)((fVar44 * fVar41 + fVar42 * fVar38 + (float)iVar12) * auVar36._4_4_);
                auVar40 = packssdw(auVar39,auVar39);
                *(long *)(count_ctx._0_8_ + lVar19) = auVar40._0_8_;
              }
              psVar18 = (stbtt_vertex *)ImGui::MemAlloc((ulong)(uVar13 + uVar15) * 0xe);
              if (psVar18 == (stbtt_vertex *)0x0) {
                if (vertices != (stbtt_vertex *)0x0) {
                  ImGui::MemFree(vertices);
                }
                if (ptr != 0) {
                  ImGui::MemFree((void *)ptr);
                }
                goto LAB_0012b401;
              }
              if (0 < (int)uVar15) {
                memcpy(psVar18,vertices,uVar22 * 0xe);
              }
              memcpy(psVar18 + uVar22,(void *)ptr,(ulong)uVar13 * 0xe);
              if (vertices != (stbtt_vertex *)0x0) {
                ImGui::MemFree(vertices);
              }
              ImGui::MemFree((void *)ptr);
              vertices = psVar18;
              uVar15 = uVar13 + uVar15;
            }
            uVar22 = (ulong)uVar15;
            puVar17 = local_120;
          }
        }
        else {
          if ((short)((ushort)puVar4[uVar16] << 8) < 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imstb_truetype.h"
                          ,0x740,
                          "int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *, int, stbtt_vertex **)"
                         );
          }
          uVar15 = 0;
          vertices = (stbtt_vertex *)0x0;
        }
      }
      else {
        uVar15 = (uint)uVar10 * 2;
        uVar22 = (ulong)uVar15;
        bVar25 = puVar4[uVar22 + uVar16 + 10];
        bVar27 = puVar4[uVar22 + uVar16 + 0xb];
        bVar1 = puVar4[uVar22 + uVar16 + 8];
        bVar2 = puVar4[uVar22 + uVar16 + 9];
        iVar11 = (uint)bVar1 * 0x100 + (uint)bVar2;
        vertices = (stbtt_vertex *)ImGui::MemAlloc((ulong)((iVar11 + (uint)uVar10 * 2) * 0xe + 0xe))
        ;
        if (vertices == (stbtt_vertex *)0x0) {
          return 0;
        }
        puVar17 = (ushort *)(puVar4 + (ulong)bVar25 * 0x100 + (ulong)bVar27 + uVar22 + uVar16 + 0xc)
        ;
        uVar22 = uVar22 & 0xffff;
        lVar19 = (ulong)(CONCAT11(bVar1,bVar2) + 1) * 0xe;
        bVar27 = 0;
        bVar25 = 0;
        for (lVar30 = 0; lVar19 - lVar30 != 0; lVar30 = lVar30 + 0xe) {
          if (bVar27 == 0) {
            bVar25 = (byte)*puVar17;
            if ((bVar25 & 8) == 0) {
              puVar17 = (ushort *)((long)puVar17 + 1);
              bVar27 = 0;
            }
            else {
              bVar27 = *(byte *)((long)puVar17 + 1);
              puVar17 = puVar17 + 1;
            }
          }
          else {
            bVar27 = bVar27 - 1;
          }
          (&vertices[uVar22].type)[lVar30] = bVar25;
        }
        sVar26 = 0;
        for (lVar30 = 0; lVar19 - lVar30 != 0; lVar30 = lVar30 + 0xe) {
          bVar25 = (&vertices[uVar22].type)[lVar30];
          if ((bVar25 & 2) == 0) {
            if ((bVar25 & 0x10) == 0) {
              sVar26 = sVar26 + (*puVar17 << 8 | *puVar17 >> 8);
              puVar17 = puVar17 + 1;
            }
          }
          else {
            uVar29 = *puVar17;
            puVar17 = (ushort *)((long)puVar17 + 1);
            uVar10 = -(ushort)(byte)uVar29;
            if ((bVar25 & 0x10) != 0) {
              uVar10 = (ushort)(byte)uVar29;
            }
            sVar26 = sVar26 + uVar10;
          }
          *(short *)((long)&vertices[uVar22].x + lVar30) = sVar26;
        }
        sVar26 = 0;
        for (lVar30 = 0; lVar19 - lVar30 != 0; lVar30 = lVar30 + 0xe) {
          bVar25 = (&vertices[uVar22].type)[lVar30];
          if ((bVar25 & 4) == 0) {
            if ((bVar25 & 0x20) == 0) {
              sVar26 = sVar26 + (*puVar17 << 8 | *puVar17 >> 8);
              puVar17 = puVar17 + 1;
            }
          }
          else {
            uVar10 = *puVar17;
            puVar17 = (ushort *)((long)puVar17 + 1);
            uVar29 = -(ushort)(byte)uVar10;
            if ((bVar25 & 0x20) != 0) {
              uVar29 = (ushort)(byte)uVar10;
            }
            sVar26 = sVar26 + uVar29;
          }
          *(short *)((long)&vertices[uVar22].y + lVar30) = sVar26;
        }
        iVar12 = 0;
        uVar13 = 0;
        local_108 = 0;
        local_110 = 0;
        uVar22 = 0;
        uVar28 = 0;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_c8._0_8_;
        local_c8 = auVar8 << 0x40;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_f8;
        _local_f8 = auVar9 << 0x40;
        iVar34 = 0;
        iVar21 = 0;
        iVar14 = 0;
        num_vertices = 0;
        while( true ) {
          cy = (int)local_110;
          cx = (int)local_108;
          if (iVar11 < iVar14) break;
          lVar19 = (long)(int)(iVar14 + uVar15);
          bVar25 = vertices[lVar19].type;
          sVar26 = vertices[lVar19].x;
          sVar3 = vertices[lVar19].y;
          uVar23 = (uint)sVar26;
          uVar24 = (ulong)uVar23;
          uVar31 = (uint)sVar3;
          uVar32 = (ulong)uVar31;
          if (iVar34 == iVar14) {
            if (iVar34 != 0) {
              num_vertices = stbtt__close_shape(vertices,num_vertices,iVar12,uVar13,
                                                (stbtt_int32)uVar22,(stbtt_int32)uVar28,
                                                local_c8._0_4_,local_f8._0_4_,cx,cy);
            }
            uVar22 = local_c8._0_8_;
            uVar28 = uVar32;
            auVar33 = local_f8;
            iVar14 = iVar34;
            if ((bVar25 & 1) == 0) {
              uVar22 = uVar24;
              auVar33 = (undefined1  [8])uVar32;
              if ((vertices[lVar19 + 1].type & 1) == 0) {
                uVar24 = (ulong)(uint)((int)((int)vertices[lVar19 + 1].x + uVar23) >> 1);
                uVar28 = (ulong)(uint)((int)((int)vertices[lVar19 + 1].y + uVar31) >> 1);
              }
              else {
                uVar24 = (ulong)(uint)(int)vertices[lVar19 + 1].x;
                uVar28 = (ulong)(uint)(int)vertices[lVar19 + 1].y;
                iVar14 = iVar34 + 1;
              }
            }
            uVar13 = bVar25 & 1 ^ 1;
            vertices[num_vertices].type = '\x01';
            vertices[num_vertices].x = (short)uVar24;
            vertices[num_vertices].y = (short)uVar28;
            vertices[num_vertices].cx = 0;
            vertices[num_vertices].cy = 0;
            iVar34 = (ushort)(*(ushort *)(puVar4 + (long)iVar21 * 2 + uVar16 + 10) << 8 |
                             *(ushort *)(puVar4 + (long)iVar21 * 2 + uVar16 + 10) >> 8) + 1;
            iVar21 = iVar21 + 1;
            iVar12 = 0;
            local_c8._0_8_ = uVar22;
            local_f8 = auVar33;
            uVar22 = uVar24;
            num_vertices = num_vertices + 1;
          }
          else {
            sVar20 = (short)local_110;
            if ((bVar25 & 1) == 0) {
              local_110 = uVar32;
              if (iVar12 == 0) {
                iVar12 = 1;
                local_108 = uVar24;
              }
              else {
                vertices[num_vertices].type = '\x03';
                vertices[num_vertices].x = (short)(cx + uVar23 >> 1);
                vertices[num_vertices].y = (short)(uVar31 + cy >> 1);
                vertices[num_vertices].cx = (short)local_108;
                vertices[num_vertices].cy = sVar20;
                iVar12 = 1;
                num_vertices = num_vertices + 1;
                local_108 = uVar24;
              }
            }
            else {
              psVar18 = vertices + num_vertices;
              if (iVar12 == 0) {
                psVar18->type = '\x02';
                psVar18->x = sVar26;
                psVar18->y = sVar3;
                psVar18->cx = 0;
                sVar20 = 0;
              }
              else {
                psVar18->type = '\x03';
                psVar18->x = sVar26;
                psVar18->y = sVar3;
                psVar18->cx = (short)local_108;
              }
              psVar18->cy = sVar20;
              iVar12 = 0;
              num_vertices = num_vertices + 1;
            }
          }
          iVar14 = iVar14 + 1;
        }
        uVar15 = stbtt__close_shape(vertices,num_vertices,iVar12,uVar13,(stbtt_int32)uVar22,
                                    (stbtt_int32)uVar28,local_c8._0_4_,local_f8._0_4_,cx,cy);
      }
      *pvertices = vertices;
    }
  }
  else {
    count_ctx.first_x = 0.0;
    count_ctx.first_y = 0.0;
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    count_ctx.bounds = 1;
    count_ctx.started = 0;
    local_a8.min_y = 0;
    local_a8.max_y = 0;
    local_a8.pvertices = (stbtt_vertex *)0x0;
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    local_a8.min_x = 0;
    local_a8.max_x = 0;
    local_a8.bounds = 0;
    local_a8.started = 0;
    local_a8.first_x = 0.0;
    local_a8.first_y = 0.0;
    local_a8.num_vertices = 0;
    local_a8._52_4_ = 0;
    iVar11 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar11 != 0) {
      iVar11 = count_ctx.num_vertices;
      local_a8.pvertices = (stbtt_vertex *)ImGui::MemAlloc((long)count_ctx.num_vertices * 0xe);
      *pvertices = local_a8.pvertices;
      iVar12 = stbtt__run_charstring(info,glyph_index,&local_a8);
      if (iVar12 != 0) {
        if (local_a8.num_vertices == iVar11) {
          return iVar11;
        }
        __assert_fail("output_ctx.num_vertices == count_ctx.num_vertices",
                      "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imstb_truetype.h"
                      ,0x8c6,
                      "int stbtt__GetGlyphShapeT2(const stbtt_fontinfo *, int, stbtt_vertex **)");
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
LAB_0012b401:
    uVar15 = 0;
  }
  return uVar15;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   if (!info->cff.size)
      return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
   else
      return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}